

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# axl_cry_AppStoreReceipt.cpp
# Opt level: O2

bool axl::cry::verifyAppStoreReceipt
               (AppStoreReceipt *receipt,void *p,size_t size,void *computerGuid,
               size_t computerGuidSize,uint_t flags)

{
  char *data;
  bool bVar1;
  int iVar2;
  BUF_MEM *pBVar3;
  EVP_MD *type;
  Bio bio;
  Array<char,_axl::sl::ArrayDetails<char>_> message;
  Pkcs7 pkcs7;
  BufRef<axl::err::ErrorHdr,_axl::err::SizeOfError> local_190;
  AppStoreReceiptPayloadParser parser;
  uchar_t digest [20];
  char buffer [256];
  
  pkcs7.super_Handle<pkcs7_st_*,_axl::cry::FreePkcs7,_axl::sl::Zero<pkcs7_st_*>_>.m_h =
       (Handle<pkcs7_st_*,_axl::cry::FreePkcs7,_axl::sl::Zero<pkcs7_st_*>_>)(pkcs7_st *)0x0;
  bVar1 = Pkcs7::loadDer(&pkcs7,p,size);
  if (!bVar1) {
    bVar1 = false;
    goto LAB_0012528c;
  }
  bio.super_Handle<bio_st_*,_axl::cry::FreeBio,_axl::sl::Zero<bio_st_*>_>.m_h =
       (Handle<bio_st_*,_axl::cry::FreeBio,_axl::sl::Zero<bio_st_*>_>)(bio_st *)0x0;
  Bio::createMem(&bio);
  if ((flags & 1) == 0) {
    parser.m_receipt = (AppStoreReceipt *)0x0;
    message.super_ArrayRef<char,_axl::sl::ArrayDetails<char>_>.m_p = (char *)0x0;
    sl::StringRefBase<char,_axl::sl::StringDetailsBase<char>_>::StringRefBase
              ((StringRefBase<char,_axl::sl::StringDetailsBase<char>_> *)buffer,
               "-----BEGIN CERTIFICATE-----\nMIIEuzCCA6OgAwIBAgIBAjANBgkqhkiG9w0BAQUFADBiMQswCQYDVQQGEwJVUzET\nMBEGA1UEChMKQXBwbGUgSW5jLjEmMCQGA1UECxMdQXBwbGUgQ2VydGlmaWNhdGlv\nbiBBdXRob3JpdHkxFjAUBgNVBAMTDUFwcGxlIFJvb3QgQ0EwHhcNMDYwNDI1MjE0\nMDM2WhcNMzUwMjA5MjE0MDM2WjBiMQswCQYDVQQGEwJVUzETMBEGA1UEChMKQXBw\nbGUgSW5jLjEmMCQGA1UECxMdQXBwbGUgQ2VydGlmaWNhdGlvbiBBdXRob3JpdHkx\nFjAUBgNVBAMTDUFwcGxlIFJvb3QgQ0EwggEiMA0GCSqGSIb3DQEBAQUAA4IBDwAw\nggEKAoIBAQDkkakJH5HbHkdQ6wXtXnmELes2oldMVeyLGYne+Uts9QerIjAC6Bg+\n+FAJ039BqJj50cpmnCRrEdCju+QbKsMflZ56DKRHi1vUFjczy8QPTc4UadHJGXL1\nXQ7Vf1+b8iUDulWPTV0N8WQ1IxVLFVkds5T39pyez1C6wVhQZ48ItCD3y6wsIG9w\ntj8BMIy3Q88PnT3zK0koGsj+zrW5DtleHNbLPbU6rfQPDgCSC7EhFi501TwN22IW\nq6NxkkdTVcGvL0Gz+PvjcM3mo0xFfh9Ma1CWQYnEdGILEINBhzOKgbEwWOxaBDKM\naLOPHd5lc/9nXmW8Sdh2nzMUZaF3lMktAgMBAAGjggF6MIIBdjAOBgNVHQ8BAf8E\nBAMCAQYwDwYDVR0TAQH/BAUwAwEB/zAdBgNVHQ4EFgQUK9BpR5R2Cf70a40uQKb3\nR01/CF4wHwYDVR0jBBgwFoAUK9BpR5R2Cf70a40uQKb3R01/CF4wggERBgNVHSAE\nggEIMIIBBDCCAQAGCSqGSIb3Y2QFATCB8jAqBggrBgEFBQcCARYeaHR0cHM6Ly93\nd3cuYXBwbGUuY29tL2FwcGxlY2EvMIHDBggrBgEFBQcCAjCBthqBs1JlbGlhbmNl\nIG9uIHRoaXMgY2VydGlmaWNhdGUgYnkgYW55IHBhcnR5IGFzc3VtZXMgYWNjZXB0\nYW5jZSBvZiB0aGUgdGhlbiBhcHBsaWNhYmxlIHN0YW5kYXJkIHRlcm1zIGFuZCBj\nb25kaXRpb25zIG9mIHVzZSwgY2VydGlmaWNhdGUgcG9saWN5IGFuZCBjZXJ0aWZp\nY2F0aW9uIHByYWN0aWNlIHN0YXRlbWVudHMuMA0GCSqGSIb3DQEBBQUAA4IBAQBc\nNplMLXi37Yyb3PN3m/J20ncwT8EfhYOFG5k9RzfyqZtAjizUsZAS2L70c5vu0mQP\ny3lPNNiiPvl4/2vIB+x9OYOLUyDTOMSxv5pPCmv/K/xZpwUJfBdAVhEedNO3iyM7\nR6PVbyTi69G3cN8PReEnyvFteO3ntRcXqNx+IjXKJdXZD9Zr1KIkIxH3oayPc4Fg\nxhtbCS+SsvhESPBgOJ4V9T0mZyCKM2r3DYLP3uujL/lTaltkwGMzd/c6ByxW69oP\nIQ7aunMZT7XZNn/Bh1XZp5m5MkL72NVxnn6hUrcbvZNCJBIqxw8dtk2cXmPIS4AX\nUKqK1drk/NAJBzewdXUh\n-----END CERTIFICATE-----\n"
               ,0x6a4,false);
    bVar1 = X509Cert::loadPem((X509Cert *)&parser,(StringRef *)buffer);
    if (((bVar1) && (bVar1 = X509Store::create((X509Store *)&message), bVar1)) &&
       (bVar1 = X509Store::addCert((X509Store *)&message,(X509 *)parser.m_receipt), bVar1)) {
      iVar2 = Pkcs7::verify(&pkcs7,(EVP_PKEY_CTX *)0x0,
                            (uchar *)message.super_ArrayRef<char,_axl::sl::ArrayDetails<char>_>.m_p,
                            0,(uchar *)bio.
                                       super_Handle<bio_st_*,_axl::cry::FreeBio,_axl::sl::Zero<bio_st_*>_>
                                       .m_h,0);
      sl::StringRefBase<char,_axl::sl::StringDetailsBase<char>_>::~StringRefBase
                ((StringRefBase<char,_axl::sl::StringDetailsBase<char>_> *)buffer);
      sl::Handle<x509_store_st_*,_axl::cry::FreeX509Store,_axl::sl::Zero<x509_store_st_*>_>::~Handle
                ((Handle<x509_store_st_*,_axl::cry::FreeX509Store,_axl::sl::Zero<x509_store_st_*>_>
                  *)&message);
      sl::Handle<x509_st_*,_axl::cry::FreeX509,_axl::sl::Zero<x509_st_*>_>::~Handle
                ((Handle<x509_st_*,_axl::cry::FreeX509,_axl::sl::Zero<x509_st_*>_> *)&parser);
      if ((char)iVar2 != '\0') goto LAB_00125146;
    }
    else {
      sl::StringRefBase<char,_axl::sl::StringDetailsBase<char>_>::~StringRefBase
                ((StringRefBase<char,_axl::sl::StringDetailsBase<char>_> *)buffer);
      sl::Handle<x509_store_st_*,_axl::cry::FreeX509Store,_axl::sl::Zero<x509_store_st_*>_>::~Handle
                ((Handle<x509_store_st_*,_axl::cry::FreeX509Store,_axl::sl::Zero<x509_store_st_*>_>
                  *)&message);
      sl::Handle<x509_st_*,_axl::cry::FreeX509,_axl::sl::Zero<x509_st_*>_>::~Handle
                ((Handle<x509_st_*,_axl::cry::FreeX509,_axl::sl::Zero<x509_st_*>_> *)&parser);
    }
LAB_00125281:
    bVar1 = false;
  }
  else {
    iVar2 = Pkcs7::verify(&pkcs7,(EVP_PKEY_CTX *)0x0,(uchar *)0x0,0,
                          (uchar *)bio.
                                   super_Handle<bio_st_*,_axl::cry::FreeBio,_axl::sl::Zero<bio_st_*>_>
                                   .m_h,0x24);
    if ((char)iVar2 == '\0') goto LAB_00125281;
LAB_00125146:
    pBVar3 = Bio::getBufMem(&bio);
    parser.m_attributeId = AttributeId_Undefined;
    parser.m_receipt = (AppStoreReceipt *)0x0;
    parser.m_iap = (AppStoreIap *)0x0;
    parser.m_attributeIntegerSize = 0;
    parser.m_attributeString = (String *)0x0;
    parser.m_attributeInteger = (void *)0x0;
    bVar1 = AppStoreReceiptPayloadParser::parse(&parser,receipt,pBVar3->data,pBVar3->length);
    if (!bVar1) goto LAB_00125281;
    bVar1 = true;
    if ((flags & 2) == 0) {
      sl::Array<char,_axl::sl::ArrayDetails<char>_>::Array(&message,BufKind_Exclusive,buffer,0x100);
      sl::Array<char,_axl::sl::ArrayDetails<char>_>::append
                (&message,(char *)computerGuid,computerGuidSize);
      sl::Array<char,_axl::sl::ArrayDetails<char>_>::append
                (&message,(receipt->m_opaque).super_ArrayRef<char,_axl::sl::ArrayDetails<char>_>.m_p
                 ,(receipt->m_opaque).super_ArrayRef<char,_axl::sl::ArrayDetails<char>_>.m_count);
      sl::Array<char,_axl::sl::ArrayDetails<char>_>::append
                (&message,(receipt->m_rawBundleId).
                          super_ArrayRef<char,_axl::sl::ArrayDetails<char>_>.m_p,
                 (receipt->m_rawBundleId).super_ArrayRef<char,_axl::sl::ArrayDetails<char>_>.m_count
                );
      data = message.super_ArrayRef<char,_axl::sl::ArrayDetails<char>_>.m_p;
      type = EVP_sha1();
      EVP_Digest(data,message.super_ArrayRef<char,_axl::sl::ArrayDetails<char>_>.m_count,digest,
                 (uint *)0x0,type,(ENGINE *)0x0);
      if (((receipt->m_sha1Hash).super_ArrayRef<char,_axl::sl::ArrayDetails<char>_>.m_count == 0x14)
         && (iVar2 = bcmp((receipt->m_sha1Hash).super_ArrayRef<char,_axl::sl::ArrayDetails<char>_>.
                          m_p,digest,0x14), iVar2 == 0)) {
        bVar1 = true;
      }
      else {
        err::ErrorRef::ErrorRef((ErrorRef *)&local_190,"app receipt SHA1 hash mismatch");
        err::setError((ErrorRef *)&local_190);
        rc::BufRef<axl::err::ErrorHdr,_axl::err::SizeOfError>::~BufRef(&local_190);
        bVar1 = false;
      }
      sl::ArrayRef<char,_axl::sl::ArrayDetails<char>_>::~ArrayRef
                (&message.super_ArrayRef<char,_axl::sl::ArrayDetails<char>_>);
    }
  }
  sl::Handle<bio_st_*,_axl::cry::FreeBio,_axl::sl::Zero<bio_st_*>_>::~Handle
            (&bio.super_Handle<bio_st_*,_axl::cry::FreeBio,_axl::sl::Zero<bio_st_*>_>);
LAB_0012528c:
  sl::Handle<pkcs7_st_*,_axl::cry::FreePkcs7,_axl::sl::Zero<pkcs7_st_*>_>::~Handle
            (&pkcs7.super_Handle<pkcs7_st_*,_axl::cry::FreePkcs7,_axl::sl::Zero<pkcs7_st_*>_>);
  return bVar1;
}

Assistant:

bool
verifyAppStoreReceipt(
	AppStoreReceipt* receipt,
	const void* p,
	size_t size,
	const void* computerGuid,
	size_t computerGuidSize,
	uint_t flags
) {
	static const char appleRootCertPem[] =
		"-----BEGIN CERTIFICATE-----\n"
		"MIIEuzCCA6OgAwIBAgIBAjANBgkqhkiG9w0BAQUFADBiMQswCQYDVQQGEwJVUzET\n"
		"MBEGA1UEChMKQXBwbGUgSW5jLjEmMCQGA1UECxMdQXBwbGUgQ2VydGlmaWNhdGlv\n"
		"biBBdXRob3JpdHkxFjAUBgNVBAMTDUFwcGxlIFJvb3QgQ0EwHhcNMDYwNDI1MjE0\n"
		"MDM2WhcNMzUwMjA5MjE0MDM2WjBiMQswCQYDVQQGEwJVUzETMBEGA1UEChMKQXBw\n"
		"bGUgSW5jLjEmMCQGA1UECxMdQXBwbGUgQ2VydGlmaWNhdGlvbiBBdXRob3JpdHkx\n"
		"FjAUBgNVBAMTDUFwcGxlIFJvb3QgQ0EwggEiMA0GCSqGSIb3DQEBAQUAA4IBDwAw\n"
		"ggEKAoIBAQDkkakJH5HbHkdQ6wXtXnmELes2oldMVeyLGYne+Uts9QerIjAC6Bg+\n"
		"+FAJ039BqJj50cpmnCRrEdCju+QbKsMflZ56DKRHi1vUFjczy8QPTc4UadHJGXL1\n"
		"XQ7Vf1+b8iUDulWPTV0N8WQ1IxVLFVkds5T39pyez1C6wVhQZ48ItCD3y6wsIG9w\n"
		"tj8BMIy3Q88PnT3zK0koGsj+zrW5DtleHNbLPbU6rfQPDgCSC7EhFi501TwN22IW\n"
		"q6NxkkdTVcGvL0Gz+PvjcM3mo0xFfh9Ma1CWQYnEdGILEINBhzOKgbEwWOxaBDKM\n"
		"aLOPHd5lc/9nXmW8Sdh2nzMUZaF3lMktAgMBAAGjggF6MIIBdjAOBgNVHQ8BAf8E\n"
		"BAMCAQYwDwYDVR0TAQH/BAUwAwEB/zAdBgNVHQ4EFgQUK9BpR5R2Cf70a40uQKb3\n"
		"R01/CF4wHwYDVR0jBBgwFoAUK9BpR5R2Cf70a40uQKb3R01/CF4wggERBgNVHSAE\n"
		"ggEIMIIBBDCCAQAGCSqGSIb3Y2QFATCB8jAqBggrBgEFBQcCARYeaHR0cHM6Ly93\n"
		"d3cuYXBwbGUuY29tL2FwcGxlY2EvMIHDBggrBgEFBQcCAjCBthqBs1JlbGlhbmNl\n"
		"IG9uIHRoaXMgY2VydGlmaWNhdGUgYnkgYW55IHBhcnR5IGFzc3VtZXMgYWNjZXB0\n"
		"YW5jZSBvZiB0aGUgdGhlbiBhcHBsaWNhYmxlIHN0YW5kYXJkIHRlcm1zIGFuZCBj\n"
		"b25kaXRpb25zIG9mIHVzZSwgY2VydGlmaWNhdGUgcG9saWN5IGFuZCBjZXJ0aWZp\n"
		"Y2F0aW9uIHByYWN0aWNlIHN0YXRlbWVudHMuMA0GCSqGSIb3DQEBBQUAA4IBAQBc\n"
		"NplMLXi37Yyb3PN3m/J20ncwT8EfhYOFG5k9RzfyqZtAjizUsZAS2L70c5vu0mQP\n"
		"y3lPNNiiPvl4/2vIB+x9OYOLUyDTOMSxv5pPCmv/K/xZpwUJfBdAVhEedNO3iyM7\n"
		"R6PVbyTi69G3cN8PReEnyvFteO3ntRcXqNx+IjXKJdXZD9Zr1KIkIxH3oayPc4Fg\n"
		"xhtbCS+SsvhESPBgOJ4V9T0mZyCKM2r3DYLP3uujL/lTaltkwGMzd/c6ByxW69oP\n"
		"IQ7aunMZT7XZNn/Bh1XZp5m5MkL72NVxnn6hUrcbvZNCJBIqxw8dtk2cXmPIS4AX\n"
		"UKqK1drk/NAJBzewdXUh\n"
		"-----END CERTIFICATE-----\n";

	Pkcs7 pkcs7;
	bool result = pkcs7.loadDer(p, size);
	if (!result)
		return false;

	Bio bio;
	bio.createMem();

	if (flags & VerifyAppStoreReceiptFlag_SkipSignatureCheck) {
		result = pkcs7.verify(NULL, NULL, NULL, bio, PKCS7_NOVERIFY | PKCS7_NOSIGS);
	} else {
		X509Cert appleRootCert;
		X509Store store;

		result =
			appleRootCert.loadPem(sl::StringRef(appleRootCertPem, lengthof(appleRootCertPem))) &&
			store.create() &&
			store.addCert(appleRootCert) &&
			pkcs7.verify(NULL, store, NULL, bio, 0);
	}

	if (!result)
		return false;

	BUF_MEM* bufMem = bio.getBufMem();

	AppStoreReceiptPayloadParser parser;
	result = parser.parse(receipt, bufMem->data, bufMem->length);
	if (!result)
		return false;

	if (flags & VerifyAppStoreReceiptFlag_SkipHashCheck)
		return true;

	char buffer[256];
	sl::Array<char> message(rc::BufKind_Stack, buffer, sizeof(buffer));
	message.append((char*)computerGuid, computerGuidSize);
	message.append(receipt->m_opaque, receipt->m_opaque.getCount());
	message.append(receipt->m_rawBundleId, receipt->m_rawBundleId.getCount());

	uchar_t digest[20];
	EVP_Digest(message, message.getCount(), digest, NULL, EVP_sha1(), NULL);

	bool isMatch =
		receipt->m_sha1Hash.getCount() == sizeof(digest) &&
		memcmp(receipt->m_sha1Hash, digest, sizeof(digest)) == 0;

	if (!isMatch)
		return err::fail("app receipt SHA1 hash mismatch");

	return true;
}